

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  long local_1f0;
  stringstream ss;
  ostream local_1e0 [16];
  byte abStack_1d0 [96];
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1e0,(_source->_M_dataplus)._M_p,_source->_M_string_length);
  std::istream::operator>>((istream *)&local_1f0,_dest);
  if ((abStack_1d0[*(long *)(local_1f0 + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1f0);
    std::ios_base::~ios_base(local_170);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Unable to convert ",_source);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_48 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_48 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_48);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }